

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_memory_rw_debug_mips64
              (CPUState *cpu,target_ulong_conflict addr,void *ptr,target_ulong_conflict len,
              _Bool is_write)

{
  hwaddr hVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  MemTxAttrs local_b8;
  int local_b4;
  MemTxAttrs attrs;
  int asidx;
  uint8_t *buf;
  target_ulong_conflict page;
  target_ulong_conflict l;
  hwaddr phys_addr;
  ulong uStack_88;
  _Bool is_write_local;
  target_ulong_conflict len_local;
  void *ptr_local;
  target_ulong_conflict addr_local;
  CPUState *cpu_local;
  FlatView *fv;
  MemoryRegion *mr;
  void *ptr_1;
  hwaddr addr1;
  hwaddr l_1;
  MemTxResult result;
  
  ptr_local = (void *)CONCAT44(in_register_00000034,addr);
  uStack_88 = CONCAT44(in_register_0000000c,len);
  _attrs = ptr;
  while( true ) {
    if (uStack_88 == 0) {
      return 0;
    }
    hVar1 = cpu_get_phys_page_attrs_debug(cpu,(ulong)ptr_local & 0xfffffffffffff000,&local_b8);
    local_b4 = cpu_asidx_from_attrs(cpu,local_b8);
    if (hVar1 == 0xffffffffffffffff) break;
    _page = (((ulong)ptr_local & 0xfffffffffffff000) + 0x1000) - (long)ptr_local;
    if (uStack_88 < _page) {
      _page = uStack_88;
    }
    hVar1 = ((ulong)ptr_local & 0xfff) + hVar1;
    if (is_write) {
      address_space_write_rom_mips64(cpu->cpu_ases[local_b4].as,hVar1,local_b8,_attrs,_page);
    }
    else {
      address_space_read_full_mips64(cpu->cpu_ases[local_b4].as,hVar1,local_b8,_attrs,_page);
    }
    uStack_88 = uStack_88 - _page;
    _attrs = (void *)(_page + (long)_attrs);
    ptr_local = (void *)(_page + (long)ptr_local);
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}